

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

void swrenderer::R_ClearPlanes(bool fullclear)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  undefined2 uVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  visplane_t *vis;
  ulong uVar14;
  undefined7 in_register_00000039;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar55;
  undefined1 auVar51 [16];
  int iVar56;
  undefined1 auVar52 [16];
  int iVar57;
  undefined1 auVar53 [16];
  int iVar58;
  undefined1 auVar54 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  
  if ((int)CONCAT71(in_register_00000039,fullclear) != 0) {
    lVar8 = 0;
    puVar11 = (undefined8 *)freehead;
    do {
      *puVar11 = (&visplanes)[lVar8];
      (&visplanes)[lVar8] = 0;
      uVar10 = (undefined2)viewheight;
      auVar7 = _DAT_005d6240;
      puVar12 = (undefined8 *)*puVar11;
      while (puVar13 = puVar12, puVar13 != (undefined8 *)0x0) {
        puVar11 = puVar13;
        freehead = (undefined *)puVar13;
        puVar12 = (undefined8 *)*puVar13;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x81);
    uVar9 = (ulong)(uint)viewwidth;
    if (uVar9 != 0) {
      lVar8 = uVar9 - 1;
      auVar15._8_4_ = (int)lVar8;
      auVar15._0_8_ = lVar8;
      auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar14 = 0;
      auVar15 = auVar15 ^ _DAT_005d6240;
      auVar30 = _DAT_005d6f50;
      auVar61 = _DAT_005d6f60;
      auVar65 = _DAT_005d6f70;
      auVar34 = _DAT_005d6230;
      do {
        auVar21 = auVar34 ^ auVar7;
        iVar49 = auVar15._0_4_;
        iVar48 = -(uint)(iVar49 < auVar21._0_4_);
        iVar50 = auVar15._4_4_;
        auVar22._4_4_ = -(uint)(iVar50 < auVar21._4_4_);
        iVar56 = auVar15._8_4_;
        iVar55 = -(uint)(iVar56 < auVar21._8_4_);
        iVar58 = auVar15._12_4_;
        auVar22._12_4_ = -(uint)(iVar58 < auVar21._12_4_);
        auVar41._4_4_ = iVar48;
        auVar41._0_4_ = iVar48;
        auVar41._8_4_ = iVar55;
        auVar41._12_4_ = iVar55;
        auVar59 = pshuflw(in_XMM11,auVar41,0xe8);
        auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar50);
        auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar58);
        auVar24._0_4_ = auVar24._4_4_;
        auVar24._8_4_ = auVar24._12_4_;
        auVar64 = pshuflw(in_XMM12,auVar24,0xe8);
        auVar22._0_4_ = auVar22._4_4_;
        auVar22._8_4_ = auVar22._12_4_;
        auVar60 = pshuflw(auVar59,auVar22,0xe8);
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar21 = (auVar60 | auVar64 & auVar59) ^ auVar21;
        auVar21 = packssdw(auVar21,auVar21);
        if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&floorclip + uVar14) = uVar10;
        }
        auVar22 = auVar24 & auVar41 | auVar22;
        auVar21 = packssdw(auVar22,auVar22);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar21 = packssdw(auVar21 ^ auVar60,auVar21 ^ auVar60);
        if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)((long)&DAT_01784592 + uVar14) = uVar10;
        }
        auVar21 = auVar65 ^ auVar7;
        iVar48 = -(uint)(iVar49 < auVar21._0_4_);
        auVar51._4_4_ = -(uint)(iVar50 < auVar21._4_4_);
        iVar55 = -(uint)(iVar56 < auVar21._8_4_);
        auVar51._12_4_ = -(uint)(iVar58 < auVar21._12_4_);
        auVar23._4_4_ = iVar48;
        auVar23._0_4_ = iVar48;
        auVar23._8_4_ = iVar55;
        auVar23._12_4_ = iVar55;
        auVar40._4_4_ = -(uint)(auVar21._4_4_ == iVar50);
        auVar40._12_4_ = -(uint)(auVar21._12_4_ == iVar58);
        auVar40._0_4_ = auVar40._4_4_;
        auVar40._8_4_ = auVar40._12_4_;
        auVar51._0_4_ = auVar51._4_4_;
        auVar51._8_4_ = auVar51._12_4_;
        auVar21 = auVar40 & auVar23 | auVar51;
        auVar21 = packssdw(auVar21,auVar21);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar21 = packssdw(auVar21 ^ auVar1,auVar21 ^ auVar1);
        if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_01784594 + uVar14) = uVar10;
        }
        auVar24 = pshufhw(auVar23,auVar23,0x84);
        auVar41 = pshufhw(auVar40,auVar40,0x84);
        auVar22 = pshufhw(auVar24,auVar51,0x84);
        auVar25._8_4_ = 0xffffffff;
        auVar25._0_8_ = 0xffffffffffffffff;
        auVar25._12_4_ = 0xffffffff;
        auVar25 = (auVar22 | auVar41 & auVar24) ^ auVar25;
        auVar24 = packssdw(auVar25,auVar25);
        if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_01784596 + uVar14) = uVar10;
        }
        auVar24 = auVar61 ^ auVar7;
        iVar48 = -(uint)(iVar49 < auVar24._0_4_);
        auVar27._4_4_ = -(uint)(iVar50 < auVar24._4_4_);
        iVar55 = -(uint)(iVar56 < auVar24._8_4_);
        auVar27._12_4_ = -(uint)(iVar58 < auVar24._12_4_);
        auVar42._4_4_ = iVar48;
        auVar42._0_4_ = iVar48;
        auVar42._8_4_ = iVar55;
        auVar42._12_4_ = iVar55;
        auVar21 = pshuflw(auVar21,auVar42,0xe8);
        auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar50);
        auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar58);
        auVar26._0_4_ = auVar26._4_4_;
        auVar26._8_4_ = auVar26._12_4_;
        auVar24 = pshuflw(auVar64 & auVar59,auVar26,0xe8);
        in_XMM12 = auVar24 & auVar21;
        auVar27._0_4_ = auVar27._4_4_;
        auVar27._8_4_ = auVar27._12_4_;
        auVar21 = pshuflw(auVar21,auVar27,0xe8);
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        auVar59 = (auVar21 | in_XMM12) ^ auVar59;
        auVar21 = packssdw(auVar59,auVar59);
        if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_01784598 + uVar14) = uVar10;
        }
        auVar27 = auVar26 & auVar42 | auVar27;
        auVar21 = packssdw(auVar27,auVar27);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar21 = packssdw(auVar21 ^ auVar64,auVar21 ^ auVar64);
        if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_0178459a + uVar14) = uVar10;
        }
        auVar21 = auVar30 ^ auVar7;
        iVar49 = -(uint)(iVar49 < auVar21._0_4_);
        auVar52._4_4_ = -(uint)(iVar50 < auVar21._4_4_);
        iVar56 = -(uint)(iVar56 < auVar21._8_4_);
        auVar52._12_4_ = -(uint)(iVar58 < auVar21._12_4_);
        auVar28._4_4_ = iVar49;
        auVar28._0_4_ = iVar49;
        auVar28._8_4_ = iVar56;
        auVar28._12_4_ = iVar56;
        auVar43._4_4_ = -(uint)(auVar21._4_4_ == iVar50);
        auVar43._12_4_ = -(uint)(auVar21._12_4_ == iVar58);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        auVar21 = auVar43 & auVar28 | auVar52;
        auVar21 = packssdw(auVar21,auVar21);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar21 ^ auVar2,auVar21 ^ auVar2);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_0178459c + uVar14) = uVar10;
        }
        auVar21 = pshufhw(auVar28,auVar28,0x84);
        auVar22 = pshufhw(auVar43,auVar43,0x84);
        auVar24 = pshufhw(auVar21,auVar52,0x84);
        auVar29._8_4_ = 0xffffffff;
        auVar29._0_8_ = 0xffffffffffffffff;
        auVar29._12_4_ = 0xffffffff;
        auVar29 = (auVar24 | auVar22 & auVar21) ^ auVar29;
        auVar21 = packssdw(auVar29,auVar29);
        if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_0178459e + uVar14) = uVar10;
        }
        lVar8 = auVar34._8_8_;
        auVar34._0_8_ = auVar34._0_8_ + 8;
        auVar34._8_8_ = lVar8 + 8;
        lVar8 = auVar65._8_8_;
        auVar65._0_8_ = auVar65._0_8_ + 8;
        auVar65._8_8_ = lVar8 + 8;
        lVar8 = auVar61._8_8_;
        auVar61._0_8_ = auVar61._0_8_ + 8;
        auVar61._8_8_ = lVar8 + 8;
        lVar8 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 8;
        auVar30._8_8_ = lVar8 + 8;
        uVar14 = uVar14 + 0x10;
      } while ((uVar9 * 2 + 0xe & 0xfffffffffffffff0) != uVar14);
    }
    auVar7 = _DAT_005d6240;
    if (((screen->Accel2D != false) ||
        (iVar49 = ConBottom - viewwindowy, iVar49 == 0 || ConBottom < viewwindowy)) ||
       (bRenderingToCanvas != '\0')) {
      iVar49 = 0;
    }
    if (uVar9 != 0) {
      lVar8 = uVar9 - 1;
      auVar16._8_4_ = (int)lVar8;
      auVar16._0_8_ = lVar8;
      auVar16._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar14 = 0;
      auVar16 = auVar16 ^ _DAT_005d6240;
      auVar17 = _DAT_005d6f50;
      auVar18 = _DAT_005d6f60;
      auVar19 = _DAT_005d6f70;
      auVar20 = _DAT_005d6230;
      do {
        auVar30 = auVar20 ^ auVar7;
        iVar50 = auVar16._0_4_;
        iVar55 = -(uint)(iVar50 < auVar30._0_4_);
        iVar56 = auVar16._4_4_;
        auVar32._4_4_ = -(uint)(iVar56 < auVar30._4_4_);
        iVar58 = auVar16._8_4_;
        iVar57 = -(uint)(iVar58 < auVar30._8_4_);
        iVar48 = auVar16._12_4_;
        auVar32._12_4_ = -(uint)(iVar48 < auVar30._12_4_);
        auVar44._4_4_ = iVar55;
        auVar44._0_4_ = iVar55;
        auVar44._8_4_ = iVar57;
        auVar44._12_4_ = iVar57;
        auVar61 = pshuflw(in_XMM11,auVar44,0xe8);
        auVar31._4_4_ = -(uint)(auVar30._4_4_ == iVar56);
        auVar31._12_4_ = -(uint)(auVar30._12_4_ == iVar48);
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        auVar65 = pshuflw(in_XMM12,auVar31,0xe8);
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar30 = pshuflw(auVar61,auVar32,0xe8);
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar62 = (auVar30 | auVar65 & auVar61) ^ auVar62;
        auVar30 = packssdw(auVar62,auVar62);
        uVar10 = (undefined2)iVar49;
        if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&ceilingclip + uVar14) = uVar10;
        }
        auVar32 = auVar31 & auVar44 | auVar32;
        auVar30 = packssdw(auVar32,auVar32);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar3,auVar30 ^ auVar3);
        if ((auVar30._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)((long)&DAT_01787292 + uVar14) = uVar10;
        }
        auVar30 = auVar19 ^ auVar7;
        iVar55 = -(uint)(iVar50 < auVar30._0_4_);
        auVar53._4_4_ = -(uint)(iVar56 < auVar30._4_4_);
        iVar57 = -(uint)(iVar58 < auVar30._8_4_);
        auVar53._12_4_ = -(uint)(iVar48 < auVar30._12_4_);
        auVar33._4_4_ = iVar55;
        auVar33._0_4_ = iVar55;
        auVar33._8_4_ = iVar57;
        auVar33._12_4_ = iVar57;
        auVar45._4_4_ = -(uint)(auVar30._4_4_ == iVar56);
        auVar45._12_4_ = -(uint)(auVar30._12_4_ == iVar48);
        auVar45._0_4_ = auVar45._4_4_;
        auVar45._8_4_ = auVar45._12_4_;
        auVar53._0_4_ = auVar53._4_4_;
        auVar53._8_4_ = auVar53._12_4_;
        auVar30 = auVar45 & auVar33 | auVar53;
        auVar30 = packssdw(auVar30,auVar30);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar4,auVar30 ^ auVar4);
        if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_01787294 + uVar14) = uVar10;
        }
        auVar34 = pshufhw(auVar33,auVar33,0x84);
        auVar21 = pshufhw(auVar45,auVar45,0x84);
        auVar15 = pshufhw(auVar34,auVar53,0x84);
        auVar35._8_4_ = 0xffffffff;
        auVar35._0_8_ = 0xffffffffffffffff;
        auVar35._12_4_ = 0xffffffff;
        auVar35 = (auVar15 | auVar21 & auVar34) ^ auVar35;
        auVar34 = packssdw(auVar35,auVar35);
        if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_01787296 + uVar14) = uVar10;
        }
        auVar34 = auVar18 ^ auVar7;
        iVar55 = -(uint)(iVar50 < auVar34._0_4_);
        auVar37._4_4_ = -(uint)(iVar56 < auVar34._4_4_);
        iVar57 = -(uint)(iVar58 < auVar34._8_4_);
        auVar37._12_4_ = -(uint)(iVar48 < auVar34._12_4_);
        auVar46._4_4_ = iVar55;
        auVar46._0_4_ = iVar55;
        auVar46._8_4_ = iVar57;
        auVar46._12_4_ = iVar57;
        auVar30 = pshuflw(auVar30,auVar46,0xe8);
        auVar36._4_4_ = -(uint)(auVar34._4_4_ == iVar56);
        auVar36._12_4_ = -(uint)(auVar34._12_4_ == iVar48);
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar61 = pshuflw(auVar65 & auVar61,auVar36,0xe8);
        in_XMM12 = auVar61 & auVar30;
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        auVar30 = pshuflw(auVar30,auVar37,0xe8);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar63 = (auVar30 | in_XMM12) ^ auVar63;
        auVar30 = packssdw(auVar63,auVar63);
        if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_01787298 + uVar14) = uVar10;
        }
        auVar37 = auVar36 & auVar46 | auVar37;
        auVar30 = packssdw(auVar37,auVar37);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar5,auVar30 ^ auVar5);
        if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_0178729a + uVar14) = uVar10;
        }
        auVar30 = auVar17 ^ auVar7;
        iVar50 = -(uint)(iVar50 < auVar30._0_4_);
        auVar54._4_4_ = -(uint)(iVar56 < auVar30._4_4_);
        iVar58 = -(uint)(iVar58 < auVar30._8_4_);
        auVar54._12_4_ = -(uint)(iVar48 < auVar30._12_4_);
        auVar38._4_4_ = iVar50;
        auVar38._0_4_ = iVar50;
        auVar38._8_4_ = iVar58;
        auVar38._12_4_ = iVar58;
        auVar47._4_4_ = -(uint)(auVar30._4_4_ == iVar56);
        auVar47._12_4_ = -(uint)(auVar30._12_4_ == iVar48);
        auVar47._0_4_ = auVar47._4_4_;
        auVar47._8_4_ = auVar47._12_4_;
        auVar54._0_4_ = auVar54._4_4_;
        auVar54._8_4_ = auVar54._12_4_;
        auVar30 = auVar47 & auVar38 | auVar54;
        auVar30 = packssdw(auVar30,auVar30);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar30 ^ auVar6,auVar30 ^ auVar6);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_0178729c + uVar14) = uVar10;
        }
        auVar30 = pshufhw(auVar38,auVar38,0x84);
        auVar65 = pshufhw(auVar47,auVar47,0x84);
        auVar61 = pshufhw(auVar30,auVar54,0x84);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar39 = (auVar61 | auVar65 & auVar30) ^ auVar39;
        auVar30 = packssdw(auVar39,auVar39);
        if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)&DAT_0178729e + uVar14) = uVar10;
        }
        lVar8 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 8;
        auVar20._8_8_ = lVar8 + 8;
        lVar8 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 8;
        auVar19._8_8_ = lVar8 + 8;
        lVar8 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 8;
        auVar18._8_8_ = lVar8 + 8;
        lVar8 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 8;
        auVar17._8_8_ = lVar8 + 8;
        uVar14 = uVar14 + 0x10;
      } while ((uVar9 * 2 + 0xe & 0xfffffffffffffff0) != uVar14);
    }
    lastopening = 0;
    return;
  }
  lVar8 = 0;
  do {
    puVar11 = (undefined8 *)(&visplanes)[lVar8];
    if (puVar11 != (undefined8 *)0x0) {
      puVar12 = &visplanes + lVar8;
      do {
        puVar13 = puVar11;
        if (-1 < *(int *)(puVar11 + 0x11)) {
          *(undefined8 **)freehead = puVar11;
          *puVar12 = *puVar11;
          *puVar11 = 0;
          puVar13 = puVar12;
          freehead = (undefined *)puVar11;
        }
        puVar11 = (undefined8 *)*puVar13;
        puVar12 = puVar13;
      } while (puVar11 != (undefined8 *)0x0);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x80);
  return;
}

Assistant:

void R_ClearPlanes (bool fullclear)
{
	int i;

	// Don't clear fake planes if not doing a full clear.
	if (!fullclear)
	{
		for (i = 0; i <= MAXVISPLANES-1; i++)	// new code -- killough
		{
			for (visplane_t **probe = &visplanes[i]; *probe != NULL; )
			{
				if ((*probe)->sky < 0)
				{ // fake: move past it
					probe = &(*probe)->next;
				}
				else
				{ // not fake: move to freelist
					visplane_t *vis = *probe;
					*freehead = vis;
					*probe = vis->next;
					vis->next = NULL;
					freehead = &vis->next;
				}
			}
		}
	}
	else
	{
		for (i = 0; i <= MAXVISPLANES; i++)	// new code -- killough
		{
			for (*freehead = visplanes[i], visplanes[i] = NULL; *freehead; )
			{
				freehead = &(*freehead)->next;
			}
		}

		// opening / clipping determination
		fillshort (floorclip, viewwidth, viewheight);
		// [RH] clip ceiling to console bottom
		fillshort (ceilingclip, viewwidth,
			!screen->Accel2D && ConBottom > viewwindowy && !bRenderingToCanvas
			? (ConBottom - viewwindowy) : 0);

		lastopening = 0;
	}
}